

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linf.c
# Opt level: O1

void linffind(lindef *lin,char *buf,objnum *objp,uint *ofsp)

{
  ushort uVar1;
  uint uVar2;
  char *pcVar3;
  uchar *puVar4;
  ulong uVar5;
  mcmon objnum;
  char *pcVar6;
  uint unaff_R14D;
  uint32_t tmp;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  bool bVar10;
  
  pcVar8 = lin[2].linbuf + -1;
  if ((long)pcVar8 < 0) {
    uVar2 = 0;
    objnum = 0xffff;
  }
  else {
    uVar2 = *(uint *)buf;
    pcVar3 = (char *)0x0;
    do {
      lVar9 = (long)pcVar8 - (long)pcVar3;
      pcVar6 = pcVar3 + lVar9 / 2;
      uVar7 = (ulong)pcVar6 >> 9 & 0x1fffffffe;
      puVar4 = mcmlck((mcmcxdef *)lin[1].linofsp,*(mcmon *)((long)&lin[1].linrenp + uVar7));
      uVar5 = (ulong)((uint)pcVar6 & 0x3ff);
      objnum = *(mcmon *)(puVar4 + uVar5 * 4);
      uVar1 = *(ushort *)(puVar4 + uVar5 * 4 + 2);
      mcmunlck((mcmcxdef *)lin[1].linofsp,*(mcmon *)((long)&lin[1].linrenp + uVar7));
      puVar4 = mcmlck((mcmcxdef *)lin[1].linofsp,objnum);
      unaff_R14D = *(uint *)(puVar4 + (ulong)uVar1 + 5);
      mcmunlck((mcmcxdef *)lin[1].linofsp,objnum);
      if (unaff_R14D == uVar2) {
        *objp = objnum;
        *ofsp = (uint)uVar1;
        return;
      }
      if (unaff_R14D < uVar2) {
        pcVar3 = pcVar3 + 1;
        if (2 < lVar9 + 1U) {
          pcVar3 = pcVar6;
        }
      }
      else {
        bVar10 = pcVar6 != pcVar8;
        pcVar8 = pcVar8 + -1;
        if (bVar10) {
          pcVar8 = pcVar6;
        }
      }
    } while ((long)pcVar3 <= (long)pcVar8);
    uVar2 = (uint)uVar1;
  }
  *objp = objnum;
  *ofsp = uVar2;
  *(uint *)buf = unaff_R14D;
  return;
}

Assistant:

void linffind(lindef *lin, char *buf, objnum *objp, uint *ofsp)
{
#   define  linf ((linfdef *)lin)
    uint    pg;
    uchar  *objptr;
    uchar  *bufptr;
    long    first;
    long    last;
    long    cur;
    ulong   seekpos;
    ulong   curpos;
    objnum  objn;
    uint    ofs;

    /* get desired seek position out of buffer */
    seekpos = osrp4(buf);

    /* we haven't traversed any records yet */
    objn = MCMONINV;
    ofs = 0;
    
    /* run a binary search for the indicated line record */
    first = 0;
    last = linf->linfcrec - 1;
    for (;;)
    {
        /* make sure we're not out of records entirely */
        if (first > last)
        {
            /* return the most recent record found - it's closest */
            *objp = objn;
            *ofsp = ofs;

            /* set the position to that of the line we actually found */
            oswp4(buf, curpos);
            return;
        }

        /* split the difference */
        cur = first + (last - first)/2;

        /* calculate the page containing this item */
        pg = cur >> 10;
        
        /* get object + offset corresponding to current source line */
        objptr = mcmlck(linf->linfmem, linf->linfpg[pg]);
        bufptr = objptr + ((cur & 1023) * DBGLINFSIZ);
        objn = osrp2(bufptr);
        ofs = osrp2(bufptr + 2);
        mcmunlck(linf->linfmem, linf->linfpg[pg]);

        /* read user data out of the object's OPCLINE record */
        objptr = mcmlck(linf->linfmem, (mcmon)objn);
        bufptr = objptr + ofs + 5;
        curpos = osrp4(bufptr);
        mcmunlck(linf->linfmem, (mcmon)objn);

        /* see what we have */
        if (curpos == seekpos)
        {
            *objp = objn;
            *ofsp = ofs;
            return;
        }
        else if (curpos < seekpos)
            first = (cur == first ? first + 1 : cur);
        else
            last = (cur == last ? last - 1 : cur);
    }
    
#   undef linf
}